

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

string * __thiscall MinVR::VRDatumInt::getValueString_abi_cxx11_(VRDatumInt *this)

{
  uint *puVar1;
  string *in_RDI;
  char buffer [20];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  puVar1 = (uint *)std::__cxx11::list<int,_std::allocator<int>_>::front
                             ((list<int,_std::allocator<int>_> *)in_RDI);
  sprintf(&stack0xffffffffffffffd8,"%d",(ulong)*puVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return in_RDI;
}

Assistant:

std::string VRDatumInt::getValueString() const {
  char buffer[20];
  sprintf(buffer, "%d", value.front());
  return std::string(buffer);
}